

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Subscriber.cpp
# Opt level: O2

void __thiscall Subscriber::on_error(Subscriber *this,Poll *p,int event)

{
  ostream *poVar1;
  string asStack_48 [32];
  
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)&this->name);
  poVar1 = std::operator<<(poVar1,": on_error event_code=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,event);
  poVar1 = std::operator<<(poVar1," errno=");
  from_errno_abi_cxx11_();
  poVar1 = std::operator<<(poVar1,asStack_48);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string(asStack_48);
  Poll::unsubscribe(p,this);
  return;
}

Assistant:

void Subscriber::on_error(Poll &p, int event) {
  std::cout << this->name << ": on_error event_code=" << event << " errno=" << from_errno() << std::endl;
  p.unsubscribe(*this);
}